

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_histogram.c
# Opt level: O3

REF_STATUS ref_histogram_zone(REF_HISTOGRAM ref_histogram,FILE *file,char *zone_title,REF_DBL time)

{
  long lVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  
  iVar3 = ref_histogram->nbin;
  dVar9 = 0.0;
  if (0 < (long)iVar3) {
    lVar5 = 0;
    iVar2 = 0;
    do {
      iVar2 = iVar2 + ref_histogram->bins[lVar5];
      lVar5 = lVar5 + 1;
    } while (iVar3 != lVar5);
    if (0 < iVar2) {
      dVar9 = 1.0 / (double)iVar2;
    }
  }
  if (zone_title == (char *)0x0) {
    fprintf((FILE *)file,"ZONE I=%d, DATAPACKING=POINT, SOLUTIONTIME=%f\n",(ulong)(iVar3 - 2));
  }
  else {
    fprintf((FILE *)file,"ZONE T=\"%s\", I=%d, DATAPACKING=POINT, SOLUTIONTIME=%f\n");
  }
  uVar4 = (ulong)(uint)ref_histogram->nbin;
  if (2 < ref_histogram->nbin) {
    lVar5 = 0;
    do {
      lVar1 = lVar5 + 1;
      iVar3 = (int)lVar5;
      dVar6 = exp2((double)((iVar3 - ((int)(((uint)(uVar4 >> 0x1f) & 1) + (int)uVar4) >> 1)) + 1) *
                   (1.0 / ref_histogram->exp));
      dVar7 = exp2((double)(iVar3 - ref_histogram->nbin / 2) * (1.0 / ref_histogram->exp));
      dVar6 = ((double)ref_histogram->bins[lVar5] / (dVar6 - dVar7)) * dVar9;
      if (dVar6 <= 1e-20) {
        dVar6 = 1e-20;
      }
      dVar7 = exp2((double)(iVar3 - ref_histogram->nbin / 2) * (1.0 / ref_histogram->exp));
      dVar8 = exp2((double)((iVar3 - ref_histogram->nbin / 2) + 1) * (1.0 / ref_histogram->exp));
      fprintf((FILE *)file,"%.8e %.8e\n",(dVar8 + dVar7) * 0.5,dVar6);
      uVar4 = (ulong)ref_histogram->nbin;
      lVar5 = lVar1;
    } while (lVar1 < (long)(uVar4 - 2));
  }
  iVar3 = fflush((FILE *)file);
  if (iVar3 != 0) {
    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_histogram.c",
           0x132,"ref_histogram_zone","tec zone fflush",0,(long)iVar3);
  }
  return (uint)(iVar3 != 0);
}

Assistant:

REF_FCN REF_STATUS ref_histogram_zone(REF_HISTOGRAM ref_histogram, FILE *file,
                                      const char *zone_title, REF_DBL time) {
  REF_INT i;
  REF_INT sum;
  REF_DBL norm, area, portion, center;

  sum = 0;
  for (i = 0; i < ref_histogram_nbin(ref_histogram); i++)
    sum += ref_histogram_bin(ref_histogram, i);
  norm = 0.0;
  if (0 < sum) norm = 1.0 / (REF_DBL)sum;

  if (NULL == zone_title) {
    fprintf(file, "ZONE I=%d, DATAPACKING=POINT, SOLUTIONTIME=%f\n",
            ref_histogram_nbin(ref_histogram) - 2, time);
  } else {
    fprintf(file, "ZONE T=\"%s\", I=%d, DATAPACKING=POINT, SOLUTIONTIME=%f\n",
            zone_title, ref_histogram_nbin(ref_histogram) - 2, time);
  }
  for (i = 0; i < ref_histogram_nbin(ref_histogram) - 2; i++) {
    area = ref_histogram_to_obs(i + 1) - ref_histogram_to_obs(i);
    portion = (REF_DBL)ref_histogram_bin(ref_histogram, i) / area * norm;
    portion = MAX(portion, 1.0e-20);
    center = 0.5 * (ref_histogram_to_obs(i) + ref_histogram_to_obs(i + 1));
    fprintf(file, "%.8e %.8e\n", center, portion);
  }
  REIS(0, fflush(file), "tec zone fflush");

  return REF_SUCCESS;
}